

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingCXX.cxx
# Opt level: O3

void __thiscall
adios2sys::Encoding::CommandLineArguments::CommandLineArguments
          (CommandLineArguments *this,int ac,char **av)

{
  char *pcVar1;
  ulong uVar2;
  
  (this->argv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->argv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->argv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<char_*,_std::allocator<char_*>_>::resize(&this->argv_,(long)(ac + 1));
  if (0 < ac) {
    uVar2 = 0;
    do {
      pcVar1 = strdup(av[uVar2]);
      (this->argv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar2] = pcVar1;
      uVar2 = uVar2 + 1;
    } while ((uint)ac != uVar2);
  }
  (this->argv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
  _M_start[ac] = (char *)0x0;
  return;
}

Assistant:

Encoding::CommandLineArguments::CommandLineArguments(int ac,
                                                     char const* const* av)
{
  this->argv_.resize(ac + 1);
  for (int i = 0; i < ac; i++) {
    this->argv_[i] = strdup(av[i]);
  }
  this->argv_[ac] = nullptr;
}